

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_segment.cpp
# Opt level: O2

void duckdb::WriteDataToVarcharSegment
               (ListSegmentFunctions *functions,ArenaAllocator *allocator,ListSegment *segment,
               RecursiveUnifiedVectorFormat *input_data,idx_t *entry_idx)

{
  idx_t *piVar1;
  long *plVar2;
  sel_t *psVar3;
  bool bVar4;
  const_reference functions_00;
  ListSegment *pLVar5;
  ulong uVar6;
  ulong __n;
  idx_t row_idx;
  long lVar7;
  data_ptr_t pdVar8;
  ulong uVar9;
  ulong uVar10;
  LinkedList child_segments;
  LinkedList local_48;
  
  row_idx = *entry_idx;
  psVar3 = ((input_data->unified).sel)->sel_vector;
  if (psVar3 != (sel_t *)0x0) {
    row_idx = (idx_t)psVar3[row_idx];
  }
  bVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid
                    (&(input_data->unified).validity.super_TemplatedValidityMask<unsigned_long>,
                     row_idx);
  uVar9 = (ulong)segment->count;
  *(bool *)((long)&segment[1].count + uVar9) = !bVar4;
  uVar6 = (ulong)segment->capacity;
  if (bVar4) {
    pdVar8 = (input_data->unified).data;
    lVar7 = row_idx * 0x10;
    uVar10 = (ulong)*(uint *)(pdVar8 + lVar7);
    if (uVar10 < 0xd) {
      pdVar8 = pdVar8 + lVar7 + 4;
    }
    else {
      pdVar8 = *(data_ptr_t *)(pdVar8 + lVar7 + 8);
    }
    *(ulong *)((long)&segment[1].count + uVar9 * 8 + uVar6) = uVar10;
    local_48.last_segment = *(ListSegment **)((long)&segment[2].count + uVar6 * 9);
    piVar1 = (idx_t *)((long)&segment[1].count + uVar6 * 9);
    local_48.total_capacity = *piVar1;
    local_48.first_segment = (ListSegment *)piVar1[1];
    for (uVar9 = 0; uVar6 = uVar10 - uVar9, uVar9 <= uVar10 && uVar6 != 0; uVar9 = uVar9 + __n) {
      functions_00 = vector<duckdb::ListSegmentFunctions,_true>::back(&functions->child_functions);
      pLVar5 = GetSegment(functions_00,allocator,&local_48);
      __n = (ulong)pLVar5->capacity - (ulong)pLVar5->count;
      if (uVar6 < __n) {
        __n = uVar6;
      }
      switchD_0193dc74::default
                ((void *)((long)&pLVar5[1].count + (ulong)pLVar5->count),pdVar8 + uVar9,__n);
      pLVar5->count = pLVar5->count + (short)__n;
    }
    lVar7 = (ulong)segment->capacity * 9;
    *(ListSegment **)((long)&segment[2].count + lVar7) = local_48.last_segment;
    plVar2 = (long *)((long)&segment[1].count + lVar7);
    *plVar2 = local_48.total_capacity + uVar10;
    plVar2[1] = (long)local_48.first_segment;
  }
  else {
    *(undefined8 *)((long)&segment[1].count + uVar9 * 8 + uVar6) = 0;
  }
  return;
}

Assistant:

static void WriteDataToVarcharSegment(const ListSegmentFunctions &functions, ArenaAllocator &allocator,
                                      ListSegment *segment, RecursiveUnifiedVectorFormat &input_data,
                                      idx_t &entry_idx) {

	auto sel_entry_idx = input_data.unified.sel->get_index(entry_idx);

	// write null validity
	auto null_mask = GetNullMask(segment);
	auto valid = input_data.unified.validity.RowIsValid(sel_entry_idx);
	null_mask[segment->count] = !valid;

	// set the length of this string
	auto str_length_data = GetListLengthData(segment);

	// we can reconstruct the offset from the length
	if (!valid) {
		Store<uint64_t>(0, data_ptr_cast(str_length_data + segment->count));
		return;
	}
	auto &str_entry = UnifiedVectorFormat::GetData<string_t>(input_data.unified)[sel_entry_idx];
	auto str_data = str_entry.GetData();
	idx_t str_size = str_entry.GetSize();
	Store<uint64_t>(str_size, data_ptr_cast(str_length_data + segment->count));

	// write the characters to the linked list of child segments
	auto child_segments = Load<LinkedList>(data_ptr_cast(GetListChildData(segment)));
	idx_t current_offset = 0;
	while (current_offset < str_size) {
		auto child_segment = GetSegment(functions.child_functions.back(), allocator, child_segments);
		auto data = GetStringData(child_segment);
		idx_t copy_count = MinValue<idx_t>(str_size - current_offset, child_segment->capacity - child_segment->count);
		memcpy(data + child_segment->count, str_data + current_offset, copy_count);
		current_offset += copy_count;
		child_segment->count += copy_count;
	}
	child_segments.total_capacity += str_size;
	// store the updated linked list
	Store<LinkedList>(child_segments, data_ptr_cast(GetListChildData(segment)));
}